

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

Record * __thiscall amrex::ParmParse::getRecord(ParmParse *this,string *name,int n)

{
  PP_entry *pPVar1;
  ostream *poVar2;
  string *in_RDX;
  ParmParse *in_RDI;
  PP_entry *pe;
  ParmParse *in_stack_fffffffffffffe88;
  Record *in_stack_fffffffffffffe90;
  Record *this_00;
  string *prefix;
  ParmParse *this_01;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  ParmParse *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  _Elt_pointer in_stack_fffffffffffffef0;
  string local_d8 [4];
  string local_50 [32];
  PP_entry *local_30;
  string *local_20;
  undefined8 local_8;
  
  this_01 = in_RDI;
  local_20 = in_RDX;
  prefixedName(in_stack_fffffffffffffee0,
               (string *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  pPVar1 = anon_unknown_12::ppindex
                     ((Table *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                      (string *)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
  std::__cxx11::string::~string(local_50);
  local_30 = pPVar1;
  if (pPVar1 == (PP_entry *)0x0) {
    poVar2 = ErrorStream();
    poVar2 = std::operator<<(poVar2,"ParmParse::getRecord: record ");
    poVar2 = std::operator<<(poVar2,local_20);
    poVar2 = std::operator<<(poVar2," not found");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_8 = 0;
    Abort_host((char *)this_01);
    prefix = local_d8;
    std::__cxx11::string::string((string *)prefix);
    ParmParse(this_01,prefix);
    Record::Record(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    ~ParmParse((ParmParse *)0xf14a73);
    std::__cxx11::string::~string((string *)local_d8);
  }
  else {
    this_00 = (Record *)&stack0xfffffffffffffed0;
    ParmParse(in_stack_fffffffffffffee0,
              (Table *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    Record::Record(this_00,in_stack_fffffffffffffe88);
    ~ParmParse((ParmParse *)0xf14b27);
  }
  return (Record *)in_RDI;
}

Assistant:

ParmParse::Record
ParmParse::getRecord (const std::string& name, int n) const
{
    const PP_entry* pe = ppindex(m_table, n, prefixedName(name), true);
    if ( pe == 0 )
    {
        amrex::ErrorStream() << "ParmParse::getRecord: record " << name << " not found" << std::endl;
        amrex::Abort();
        return Record(ParmParse());
    } else {
        return Record(ParmParse(*pe->m_table));
    }
}